

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Config::~Config(Config *this)

{
  (this->super_IConfig).super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__Config_0018dde0;
  TestSpec::~TestSpec(&this->m_testSpec);
  clara::std::unique_ptr<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>::
  ~unique_ptr(&this->m_stream);
  ConfigData::~ConfigData(&this->m_data);
  return;
}

Assistant:

virtual ~Config() = default;